

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-brdf.cpp
# Opt level: O1

void renderSceneProgressive(void)

{
  (*glad_glBindFramebuffer)(0x8d40,g_gl.framebuffers[1]);
  (*glad_glViewport)(0,0,g_framebuffer.w,g_framebuffer.h);
  (*glad_glDepthFunc)(0x201);
  (*glad_glEnable)(0xb71);
  (*glad_glEnable)(0xb44);
  if (g_framebuffer.flags.reset == true) {
    (*glad_glClearColor)(0.0,0.0,0.0,(float)g_framebuffer.samplesPerPass);
    (*glad_glClear)(0x4100);
    g_framebuffer.pass = 0;
    g_framebuffer.flags.reset = false;
  }
  if (g_framebuffer.pass < 1) {
    (*glad_glDepthFunc)(0x201);
    (*glad_glDisable)(0xbe2);
  }
  else {
    (*glad_glDepthFunc)(0x203);
    (*glad_glEnable)(0xbe2);
    (*glad_glBlendFunc)(1,1);
    loadRandomBuffer();
  }
  if (g_framebuffer.samplesPerPass * g_framebuffer.pass < g_framebuffer.samplesPerPixel) {
    (*glad_glUseProgram)(g_gl.programs[1]);
    (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
    (*glad_glDrawArrays)(5,0,4);
    if (g_sphere.flags.showParametric == true) {
      (*glad_glEnable)(0xbe2);
      (*glad_glBlendFunc)(0x302,0x303);
      (*glad_glUseProgram)(g_gl.programs[7]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
      (*glad_glDrawArrays)(5,0,4);
      (*glad_glDisable)(0xbe2);
    }
    if (g_sphere.flags.showLines == true) {
      (*glad_glLineWidth)(1.5);
      (*glad_glUseProgram)(g_gl.programs[3]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[2]);
      (*glad_glDrawArraysInstanced)(2,0,g_sphere.circles.vertexCnt,g_sphere.circles.instanceCnt * 2)
      ;
    }
    if (g_sphere.flags.showSamples == true) {
      (*glad_glEnable)(0x8642);
      (*glad_glUseProgram)(g_gl.programs[4]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
      (*glad_glDrawArrays)(0,0,0x100);
      (*glad_glDisable)(0x8642);
    }
    if (g_sphere.flags.showWiHelper == true) {
      (*glad_glLineWidth)(3.0);
      (*glad_glUseProgram)(g_gl.programs[5]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[0]);
      (*glad_glDrawArrays)(1,0,2);
      (*glad_glLineWidth)(2.5);
      (*glad_glUseProgram)(g_gl.programs[6]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[2]);
      (*glad_glDrawArrays)(2,0,g_sphere.circles.vertexCnt);
    }
    if (g_sphere.flags.showSurface == true) {
      (*glad_glDisable)(0xb44);
      (*glad_glColorMask)('\0','\0','\0','\0');
      (*glad_glUseProgram)(g_gl.programs[2]);
      (*glad_glBindVertexArray)(g_gl.vertexArrays[1]);
      (*glad_glDrawElements)(4,g_sphere.sphere.indexCnt,0x1403,(void *)0x0);
      (*glad_glEnable)(0xbe2);
      (*glad_glBlendFunc)(0x302,0x303);
      (*glad_glColorMask)('\x01','\x01','\x01','\x01');
      (*glad_glDepthFunc)(0x202);
      (*glad_glDepthMask)('\0');
      (*glad_glBindVertexArray)(g_gl.vertexArrays[1]);
      (*glad_glDrawElements)(4,g_sphere.sphere.indexCnt,0x1403,(void *)0x0);
      (*glad_glDepthFunc)(0x201);
      (*glad_glDepthMask)('\x01');
      (*glad_glDisable)(0xbe2);
      (*glad_glEnable)(0xb44);
    }
    g_framebuffer.pass = g_framebuffer.pass + 1;
    g_framebuffer.flags.reset = true;
  }
  if (0 < g_framebuffer.pass) {
    (*glad_glDepthFunc)(0x201);
    (*glad_glDisable)(0xbe2);
  }
  (*glad_glDisable)(0xb44);
  (*glad_glDisable)(0xb71);
  return;
}

Assistant:

void renderSceneProgressive()
{
    // configure GL state
    glBindFramebuffer(GL_FRAMEBUFFER, g_gl.framebuffers[FRAMEBUFFER_SCENE]);
    glViewport(0, 0, g_framebuffer.w, g_framebuffer.h);
    glDepthFunc(GL_LESS);
    glEnable(GL_DEPTH_TEST);
    glEnable(GL_CULL_FACE);

    if (g_framebuffer.flags.reset) {
        glClearColor(0, 0, 0, g_framebuffer.samplesPerPass);
        glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
        g_framebuffer.pass = 0;
        g_framebuffer.flags.reset = false;
    }

    // enable blending only after the first is complete
    // (otherwise backfaces might be included in the rendering)
    if (g_framebuffer.pass > 0) {
        glDepthFunc(GL_LEQUAL);
        glEnable(GL_BLEND);
        glBlendFunc(GL_ONE, GL_ONE);
        loadRandomBuffer();
    } else {
        glDepthFunc(GL_LESS);
        glDisable(GL_BLEND);
    }

    // stop progressive drawing once the desired sampling rate has been reached
    if (g_framebuffer.pass * g_framebuffer.samplesPerPass
        < g_framebuffer.samplesPerPixel) {

        // draw background
        glUseProgram(g_gl.programs[PROGRAM_BACKGROUND]);
        glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
        glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

        // parametric space
        if (g_sphere.flags.showParametric) {
            glEnable(GL_BLEND);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
            glUseProgram(g_gl.programs[PROGRAM_PARAMETRIC]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
            glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
            glDisable(GL_BLEND);
        }

        // draw wire
        if (g_sphere.flags.showLines) {
            glLineWidth(1.5f);
            glUseProgram(g_gl.programs[PROGRAM_WIRE]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_CIRCLE]);
            glDrawArraysInstanced(GL_LINE_LOOP,
                                  0,
                                  g_sphere.circles.vertexCnt,
                                  g_sphere.circles.instanceCnt * 2);
        }

        // draw samples
        if (g_sphere.flags.showSamples) {
            glEnable(GL_PROGRAM_POINT_SIZE);
            glUseProgram(g_gl.programs[PROGRAM_SAMPLES]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
            glDrawArrays(GL_POINTS,
                         0,
                         256);
            glDisable(GL_PROGRAM_POINT_SIZE);
        }

        // draw wi helper
        if (g_sphere.flags.showWiHelper) {
            glLineWidth(3.0f);
            glUseProgram(g_gl.programs[PROGRAM_HELPER_WI_DIR]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_EMPTY]);
            glDrawArrays(GL_LINES, 0, 2);

            glLineWidth(2.5f);
            glUseProgram(g_gl.programs[PROGRAM_HELPER_WI_ANGLE]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_CIRCLE]);
            glDrawArrays(GL_LINE_LOOP,
                         0,
                         g_sphere.circles.vertexCnt);
        }


        // draw sphere
        if (g_sphere.flags.showSurface) {
#if 1
            glDisable(GL_CULL_FACE);
            glColorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);
            glUseProgram(g_gl.programs[PROGRAM_SPHERE]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_SPHERE]);
            glDrawElements(GL_TRIANGLES,
                           g_sphere.sphere.indexCnt,
                           GL_UNSIGNED_SHORT,
                           NULL);

            glEnable(GL_BLEND);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
            glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
            glDepthFunc(GL_EQUAL);
            glDepthMask(GL_FALSE);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_SPHERE]);
            glDrawElements(GL_TRIANGLES,
                           g_sphere.sphere.indexCnt,
                           GL_UNSIGNED_SHORT,
                           NULL);
            glDepthFunc(GL_LESS);
            glDepthMask(GL_TRUE);
            glDisable(GL_BLEND);
            glEnable(GL_CULL_FACE);
#else
            glUseProgram(g_gl.programs[PROGRAM_SPHERE]);
            glBindVertexArray(g_gl.vertexArrays[VERTEXARRAY_SPHERE]);
            glDrawElements(GL_TRIANGLES,
                           g_sphere.sphere.indexCnt,
                           GL_UNSIGNED_SHORT,
                           NULL);
#endif
        }

        ++g_framebuffer.pass;
        g_framebuffer.flags.reset = true;
    }

    // restore GL state
    if (g_framebuffer.pass > 0) {
        glDepthFunc(GL_LESS);
        glDisable(GL_BLEND);
    }
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
}